

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_enlarge_conforming(REF_CAVITY ref_cavity)

{
  bool bVar1;
  uint uVar2;
  int local_50;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL keep_growing;
  REF_BOOL manifold;
  REF_BOOL conforming;
  REF_INT seg;
  REF_INT node;
  REF_NODE ref_node;
  REF_CAVITY ref_cavity_local;
  
  _seg = ref_cavity->ref_grid->node;
  if (ref_cavity->surf_node == -1) {
    local_50 = ref_cavity->node;
  }
  else {
    local_50 = ref_cavity->surf_node;
  }
  conforming = local_50;
  ref_node = (REF_NODE)ref_cavity;
  if (_seg->ref_mpi->id == _seg->part[local_50]) {
    if (ref_cavity->debug != 0) {
      printf(" conforming start %d tris %d segs\n",(ulong)(uint)ref_cavity->tri_list->n,
             (ulong)(uint)ref_cavity->nseg);
    }
    if (ref_node->n == 0) {
      if ((((*(int *)&ref_node->sorted_global == 0) && (*(int *)&ref_node->age == 0)) &&
          (*(int *)ref_node->aux == 0)) && (ref_node->ref_mpi->n == 0)) {
        ref_node->n = 6;
        ref_cavity_local._4_4_ = 0;
      }
      else {
        uVar2 = ref_cavity_verify_seg_manifold((REF_CAVITY)ref_node);
        if (uVar2 == 0) {
          bVar1 = true;
          while (bVar1) {
            bVar1 = false;
            for (manifold = 0; manifold < *(int *)((long)&ref_node->sorted_global + 4);
                manifold = manifold + 1) {
              if (((-1 < manifold) && (manifold < *(int *)((long)&ref_node->sorted_global + 4))) &&
                 ((ref_node->part[manifold * 3] != -1 &&
                  ((conforming != ref_node->part[manifold * 3] &&
                   (conforming != ref_node->part[manifold * 3 + 1])))))) {
                uVar2 = ref_cavity_conforming((REF_CAVITY)ref_node,manifold,&keep_growing);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x736,"ref_cavity_enlarge_conforming",(ulong)uVar2,"free");
                  return uVar2;
                }
                if (keep_growing == 0) {
                  uVar2 = ref_cavity_enlarge_seg((REF_CAVITY)ref_node,manifold);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x738,"ref_cavity_enlarge_conforming",(ulong)uVar2,"enlarge seg");
                    return uVar2;
                  }
                  if (ref_node->n != 0) {
                    if ((*(int *)((long)&ref_node->new_n_global + 4) != 0) &&
                       (uVar2 = ref_cavity_tec((REF_CAVITY)ref_node,"enlarge.tec"), uVar2 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x73c,"ref_cavity_enlarge_conforming",(ulong)uVar2,
                             "tec for enlarge_seg fail");
                      return uVar2;
                    }
                    return 0;
                  }
                  bVar1 = true;
                }
              }
            }
          }
          if (*(int *)((long)&ref_node->new_n_global + 4) != 0) {
            printf(" conforming final %d tris %d segs\n",(ulong)*(uint *)ref_node->aux,
                   (ulong)*(uint *)&ref_node->sorted_global);
          }
          uVar2 = ref_cavity_manifold((REF_CAVITY)ref_node,&ref_private_macro_code_rss);
          if (uVar2 == 0) {
            if (ref_private_macro_code_rss == 0) {
              if (*(int *)((long)&ref_node->new_n_global + 4) != 0) {
                printf(" conforming not manifold\n");
              }
              ref_node->n = 4;
              ref_cavity_local._4_4_ = 0;
            }
            else {
              ref_node->n = 1;
              ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold((REF_CAVITY)ref_node);
              if (ref_cavity_local._4_4_ == 0) {
                ref_cavity_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x753,"ref_cavity_enlarge_conforming",(ulong)ref_cavity_local._4_4_,
                       "final seg manifold");
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x74a,"ref_cavity_enlarge_conforming",(ulong)uVar2,"manifold");
            ref_cavity_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x72b,"ref_cavity_enlarge_conforming",(ulong)uVar2,"initial seg manifold");
          ref_cavity_local._4_4_ = uVar2;
        }
      }
    }
    else {
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x71b,
           "ref_cavity_enlarge_conforming","cavity part must own node");
    ref_cavity_local._4_4_ = 1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_conforming(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node;
  REF_INT seg;
  REF_BOOL conforming, manifold;
  REF_BOOL keep_growing;

  node = ref_cavity_seg_node(ref_cavity);

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (ref_cavity_debug(ref_cavity))
    printf(" conforming start %d tris %d segs\n",
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_NOOP;
    return REF_SUCCESS;
  }

  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "initial seg manifold");

  keep_growing = REF_TRUE;
  while (keep_growing) {
    keep_growing = REF_FALSE;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;

      RSS(ref_cavity_conforming(ref_cavity, seg, &conforming), "free");
      if (!conforming) {
        RSS(ref_cavity_enlarge_seg(ref_cavity, seg), "enlarge seg");
        if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) {
          if (ref_cavity_debug(ref_cavity)) {
            RSS(ref_cavity_tec(ref_cavity, "enlarge.tec"),
                "tec for enlarge_seg fail");
          }
          return REF_SUCCESS;
        }
        keep_growing = REF_TRUE;
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf(" conforming final %d tris %d segs\n",
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  RSS(ref_cavity_manifold(ref_cavity, &manifold), "manifold");
  if (!manifold) {
    if (ref_cavity_debug(ref_cavity)) printf(" conforming not manifold\n");
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "final seg manifold");

  return REF_SUCCESS;
}